

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osMutex.cpp
# Opt level: O2

void __thiscall osMutex::Give(osMutex *this)

{
  osThread::GetCurrent();
  this->OwnerFile = (char *)0x0;
  this->OwnerLine = 0;
  this->OwnerThread = (osThread *)0x0;
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

void osMutex::Give()
{
    osThread* thread = osThread::GetCurrent();
    if (thread != OwnerThread) {}
    OwnerFile = nullptr;
    OwnerLine = 0;
    OwnerThread = nullptr;
#ifdef _WIN32
    ReleaseMutex(Handle);
#elif __linux__
    pthread_mutex_unlock(&m_mutex);
#endif
}